

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * MyGame_Example_Alt_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  int iVar1;
  flatcc_builder_ref_t fVar2;
  size_t n_1;
  char *pcVar3;
  undefined4 *puVar4;
  uint64_t *puVar5;
  uint64_t uVar6;
  void *struct_base;
  flatcc_builder_ref_t *pfVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  uint uVar19;
  ulong *puVar20;
  size_t __n;
  long lVar21;
  byte *pbVar22;
  flatcc_builder_t *pfVar23;
  byte *pbVar24;
  ulong *puVar25;
  uint *__s;
  ulong uVar26;
  bool bVar27;
  int more_1;
  int more;
  flatcc_builder_ref_t ref;
  int8_t val;
  undefined3 uStack_9b;
  uint64_t value;
  ulong *local_90;
  flatcc_builder_ref_t ref_1;
  uint64_t local_80;
  long local_78;
  undefined4 *local_70;
  size_t h_unions;
  undefined4 *local_60;
  char *base;
  undefined4 *local_50;
  uint *local_48;
  uint *local_40;
  flatcc_builder_ref_t *local_38;
  
  *result = 0;
  iVar1 = flatcc_builder_start_table(ctx->ctx,9);
  if ((iVar1 != 0) ||
     (pcVar3 = flatcc_json_parser_prepare_unions(ctx,buf,end,1,&h_unions), pcVar3 == end))
  goto LAB_00114a09;
  local_38 = result;
  if ((buf == end) || (*buf != '{')) {
    more = 0;
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
  }
  else {
    puVar25 = (ulong *)(buf + 1);
    if ((long)end - (long)puVar25 < 2) {
LAB_00114aa8:
      puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
    }
    else if ((char)(byte)*puVar25 < '!') {
      if (((byte)*puVar25 != 0x20) || (buf[2] < '!')) goto LAB_00114aa8;
      puVar25 = (ulong *)(buf + 2);
    }
    if ((puVar25 == (ulong *)end) || ((byte)*puVar25 != 0x7d)) {
      more = 1;
      buf = (char *)puVar25;
    }
    else {
      more = 0;
      buf = (char *)((long)puVar25 + 1);
      if ((long)end - (long)buf < 2) {
LAB_001176e5:
        buf = flatcc_json_parser_space_ext(ctx,buf,end);
      }
      else if (*buf < '!') {
        if ((*buf != 0x20) || ((char)*(byte *)((long)puVar25 + 2) < '!')) goto LAB_001176e5;
        buf = (char *)((long)puVar25 + 2);
      }
    }
  }
  while (more != 0) {
    if (buf != end) {
      if ((byte)*(ulong *)buf == 0x2e) {
        buf = flatcc_json_parser_set_error(ctx,buf,end,5);
      }
      else if ((byte)*(ulong *)buf == 0x22) {
        buf = (char *)((long)buf + 1);
        ctx->unquoted = 0;
      }
      else {
        ctx->unquoted = 1;
      }
    }
    uVar8 = (long)end - (long)buf;
    if (uVar8 < 8) {
      uVar26 = 0;
      switch(uVar8) {
      case 7:
        uVar26 = (long)(char)*(byte *)((long)buf + 6) << 8;
      case 6:
        uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 5) << 0x10;
      case 5:
        uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 4) << 0x18;
      case 4:
        uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 3) << 0x20;
      case 3:
        uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 2) << 0x28;
      case 2:
        uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 1) << 0x30;
      case 1:
        uVar26 = uVar26 | (ulong)(byte)*(ulong *)buf << 0x38;
      }
    }
    else {
      uVar26 = *(ulong *)buf;
      uVar26 = uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
               | uVar26 << 0x38;
    }
    if (uVar26 < 0x6d756c74696b0000) {
      if (uVar26 < 0x6d616e79616e7900) {
        if (uVar26 != 0x66697865645f6172) goto LAB_00115926;
        puVar20 = (ulong *)((long)buf + 8);
        uVar8 = (long)end - (long)puVar20;
        if (uVar8 < 8) {
          uVar19 = 0;
          uVar10 = 0;
          uVar11 = 0;
          uVar9 = 0;
          switch(uVar8) {
          case 7:
          case 6:
          case 5:
          case 4:
            uVar19 = (uint)(char)*(byte *)((long)buf + 0xb);
          case 3:
            uVar10 = uVar19 | (uint)((ulong)((long)(char)*(byte *)((long)buf + 10) << 0x28) >> 0x20)
            ;
          case 2:
            uVar11 = uVar10 | (uint)((ulong)((long)(char)*(byte *)((long)buf + 9) << 0x30) >> 0x20);
          case 1:
            uVar9 = uVar11 | (uint)(((ulong)(byte)*puVar20 << 0x38) >> 0x20);
          }
        }
        else {
          uVar26 = *puVar20;
          uVar9 = (uint)(uVar26 >> 8) & 0xff00 | (uint)(((uVar26 & 0xff00) << 0x28) >> 0x20) |
                  (uint)((uVar26 << 0x38) >> 0x20);
        }
        if (uVar9 >> 8 != 0x726179) {
LAB_001150f2:
          buf = (char *)((long)buf + 8);
          goto LAB_00115926;
        }
        puVar25 = puVar20;
        if (3 < (long)uVar8) {
          bVar18 = *(byte *)((long)buf + 0xb);
          if (ctx->unquoted == 0) {
            if (bVar18 == 0x22) {
              pbVar24 = (byte *)((long)buf + 0xc);
              goto LAB_00115266;
            }
          }
          else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
            pbVar24 = (byte *)((long)buf + 0xb);
            ctx->unquoted = 0;
LAB_00115266:
            if ((long)end - (long)pbVar24 < 2) {
LAB_001153eb:
              pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
            }
            else if ((char)*pbVar24 < '!') {
              if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_001153eb;
              pbVar24 = pbVar24 + 1;
            }
            if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
              puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,4);
            }
            else {
              puVar25 = (ulong *)(pbVar24 + 1);
              if ((long)end - (long)puVar25 < 2) {
LAB_001159f6:
                puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
              }
              else if ((char)(byte)*puVar25 < '!') {
                if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!')) goto LAB_001159f6;
                puVar25 = (ulong *)(pbVar24 + 2);
              }
            }
          }
        }
        if (puVar20 == puVar25) goto LAB_00115dad;
        puVar4 = (undefined4 *)flatcc_builder_table_add(ctx->ctx,8,0x7c,4);
        buf = (char *)puVar25;
        if (puVar4 == (undefined4 *)0x0) goto LAB_00114a09;
        if ((puVar25 == (ulong *)end) || ((byte)*puVar25 != 0x7b)) {
          more_1 = 0;
          buf = flatcc_json_parser_set_error(ctx,(char *)puVar25,end,0x15);
        }
        else {
          puVar20 = (ulong *)((long)puVar25 + 1);
          if ((long)end - (long)puVar20 < 2) {
LAB_00115aa6:
            puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
          }
          else if ((char)*(byte *)puVar20 < '!') {
            if ((*(byte *)puVar20 != 0x20) || ((char)*(byte *)((long)puVar25 + 2) < '!'))
            goto LAB_00115aa6;
            puVar20 = (ulong *)((long)puVar25 + 2);
          }
          if ((puVar20 == (ulong *)end) || ((byte)*puVar20 != 0x7d)) {
            more_1 = 1;
            buf = (char *)puVar20;
          }
          else {
            more_1 = 0;
            buf = (char *)((long)puVar20 + 1);
            if ((long)end - (long)buf < 2) {
LAB_001165d1:
              buf = flatcc_json_parser_space_ext(ctx,buf,end);
            }
            else if (*buf < '!') {
              if ((*buf != 0x20) || ((char)*(byte *)((long)puVar20 + 2) < '!')) goto LAB_001165d1;
              buf = (char *)((long)puVar20 + 2);
            }
          }
        }
        if (more_1 != 0) {
          local_60 = puVar4 + 0x1b;
          base = (char *)(puVar4 + 0x1d);
          local_40 = puVar4 + 0x10;
          local_48 = puVar4 + 0x1a;
          local_50 = puVar4;
          do {
            if (buf != end) {
              if ((byte)*(ulong *)buf == 0x2e) {
                buf = flatcc_json_parser_set_error(ctx,buf,end,5);
              }
              else if ((byte)*(ulong *)buf == 0x22) {
                buf = (char *)((long)buf + 1);
                ctx->unquoted = 0;
              }
              else {
                ctx->unquoted = 1;
              }
            }
            uVar8 = (long)end - (long)buf;
            if (uVar8 < 8) {
              uVar26 = 0;
              switch(uVar8) {
              case 7:
                uVar26 = (long)(char)*(byte *)((long)buf + 6) << 8;
              case 6:
                uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 5) << 0x10;
              case 5:
                uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 4) << 0x18;
              case 4:
                uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 3) << 0x20;
              case 3:
                uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 2) << 0x28;
              case 2:
                uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 1) << 0x30;
              case 1:
                uVar26 = uVar26 | (ulong)(byte)*(ulong *)buf << 0x38;
              }
            }
            else {
              uVar26 = *(ulong *)buf;
              uVar26 = uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                       (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                       (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                       (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38;
            }
            puVar25 = (ulong *)buf;
            if (uVar26 < 0x666f6f0000000000) {
              if ((uVar26 & 0x7fffff0000000000) == 0x6261720000000000) {
                if (3 < (long)uVar8) {
                  bVar18 = *(byte *)((long)buf + 3);
                  if (ctx->unquoted == 0) {
                    if (bVar18 == 0x22) {
                      pbVar24 = (byte *)((long)buf + 4);
                      goto LAB_00116905;
                    }
                  }
                  else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
                    pbVar24 = (byte *)((long)buf + 3);
                    ctx->unquoted = 0;
LAB_00116905:
                    if ((long)end - (long)pbVar24 < 2) {
LAB_0011698d:
                      pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
                    }
                    else if ((char)*pbVar24 < '!') {
                      if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_0011698d;
                      pbVar24 = pbVar24 + 1;
                    }
                    if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
                      puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,4);
                    }
                    else {
                      puVar25 = (ulong *)(pbVar24 + 1);
                      if ((long)end - (long)puVar25 < 2) {
LAB_00116dc2:
                        puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
                      }
                      else if ((char)(byte)*puVar25 < '!') {
                        if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!')) goto LAB_00116dc2;
                        puVar25 = (ulong *)(pbVar24 + 2);
                      }
                    }
                  }
                }
                if ((ulong *)buf == puVar25) goto LAB_0011714b;
                if ((puVar25 == (ulong *)end) || ((byte)*puVar25 != 0x5b)) {
                  more_1 = 0;
                  pbVar24 = (byte *)flatcc_json_parser_set_error(ctx,(char *)puVar25,end,0x16);
                }
                else {
                  pbVar22 = (byte *)((long)puVar25 + 1);
                  if ((long)end - (long)pbVar22 < 2) {
LAB_00116e26:
                    pbVar22 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar22,end);
                  }
                  else if ((char)*pbVar22 < '!') {
                    if ((*pbVar22 != 0x20) || ((char)*(byte *)((long)puVar25 + 2) < '!'))
                    goto LAB_00116e26;
                    pbVar22 = (byte *)((long)puVar25 + 2);
                  }
                  if ((pbVar22 == (byte *)end) || (*pbVar22 != 0x5d)) {
                    more_1 = 1;
                    pbVar24 = pbVar22;
                  }
                  else {
                    more_1 = 0;
                    pbVar24 = pbVar22 + 1;
                    if ((long)end - (long)pbVar24 < 2) {
LAB_001172d2:
                      pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
                    }
                    else if ((char)*pbVar24 < '!') {
                      if ((*pbVar24 != 0x20) || ((char)pbVar22[2] < '!')) goto LAB_001172d2;
                      pbVar24 = pbVar22 + 2;
                    }
                  }
                }
                lVar21 = 10;
                __s = local_40;
                do {
                  if (more_1 == 0) {
                    if (lVar21 == 0) goto LAB_00116fd8;
                    if ((ctx->flags & 0x10) != 0) goto LAB_00116fdd;
                    __n = lVar21 << 2;
                    goto LAB_00116fc6;
                  }
                  _val = 0;
                  value = 0;
                  local_80 = local_80 & 0xffffffff00000000;
                  pbVar22 = pbVar24;
                  if ((pbVar24 != (byte *)end) &&
                     (pbVar22 = (byte *)flatcc_json_parser_integer
                                                  (ctx,(char *)pbVar24,end,(int *)&local_80,&value),
                     pbVar22 != pbVar24)) {
                    if ((int)local_80 == 0) {
                      uVar6 = value;
                      if (value >> 0x1f == 0) goto LAB_00116f0b;
                      iVar1 = 7;
                    }
                    else {
                      if (value < 0x80000001) {
                        uVar6 = -value;
LAB_00116f0b:
                        _val = (uint)uVar6;
                        goto LAB_00116f0f;
                      }
                      iVar1 = 8;
                    }
                    pbVar22 = (byte *)flatcc_json_parser_set_error(ctx,(char *)pbVar22,end,iVar1);
                  }
LAB_00116f0f:
                  bVar27 = pbVar24 == pbVar22;
                  pbVar24 = pbVar22;
                  if ((bVar27) &&
                     (pbVar24 = (byte *)flatcc_json_parser_symbolic_int32
                                                  (ctx,(char *)pbVar22,end,
                                                   (flatcc_json_parser_integral_symbol_f **)
                                                                                                      
                                                  MyGame_Example_FooBar_parse_json_struct_inline_symbolic_parsers_217
                                                  ,(int32_t *)&val),
                     pbVar24 == (byte *)end || pbVar24 == pbVar22)) {
                    iVar1 = 6;
                    bVar27 = false;
                  }
                  else {
                    if (lVar21 == 0) {
                      if ((ctx->flags & 8) == 0) {
                        local_90 = (ulong *)flatcc_json_parser_set_error
                                                      (ctx,(char *)pbVar24,end,0x22);
                        iVar1 = 1;
                        bVar27 = false;
                        lVar21 = 0;
                        goto LAB_00116fac;
                      }
                      lVar21 = 0;
                    }
                    else {
                      *__s = _val;
                      lVar21 = lVar21 + -1;
                      __s = __s + 1;
                    }
                    pbVar24 = (byte *)flatcc_json_parser_array_end(ctx,(char *)pbVar24,end,&more_1);
                    iVar1 = 0;
                    bVar27 = true;
                  }
LAB_00116fac:
                } while (bVar27);
              }
              else {
                if ((uVar26 & 0x7fffff0000000000) != 0x636f6c0000000000) goto LAB_0011714b;
                if (3 < (long)uVar8) {
                  bVar18 = *(byte *)((long)buf + 3);
                  if (ctx->unquoted == 0) {
                    if (bVar18 == 0x22) {
                      pbVar24 = (byte *)((long)buf + 4);
                      goto LAB_001168d8;
                    }
                  }
                  else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
                    pbVar24 = (byte *)((long)buf + 3);
                    ctx->unquoted = 0;
LAB_001168d8:
                    if ((long)end - (long)pbVar24 < 2) {
LAB_00116927:
                      pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
                    }
                    else if ((char)*pbVar24 < '!') {
                      if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_00116927;
                      pbVar24 = pbVar24 + 1;
                    }
                    if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
                      puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,4);
                    }
                    else {
                      puVar25 = (ulong *)(pbVar24 + 1);
                      if ((long)end - (long)puVar25 < 2) {
LAB_00116bb5:
                        puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
                      }
                      else if ((char)(byte)*puVar25 < '!') {
                        if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!')) goto LAB_00116bb5;
                        puVar25 = (ulong *)(pbVar24 + 2);
                      }
                    }
                  }
                }
                if ((ulong *)buf == puVar25) goto LAB_0011714b;
                if ((puVar25 == (ulong *)end) || ((byte)*puVar25 != 0x5b)) {
                  more_1 = 0;
                  pbVar24 = (byte *)flatcc_json_parser_set_error(ctx,(char *)puVar25,end,0x16);
                }
                else {
                  pbVar22 = (byte *)((long)puVar25 + 1);
                  if ((long)end - (long)pbVar22 < 2) {
LAB_00116c19:
                    pbVar22 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar22,end);
                  }
                  else if ((char)*pbVar22 < '!') {
                    if ((*pbVar22 != 0x20) || ((char)*(byte *)((long)puVar25 + 2) < '!'))
                    goto LAB_00116c19;
                    pbVar22 = (byte *)((long)puVar25 + 2);
                  }
                  if ((pbVar22 == (byte *)end) || (*pbVar22 != 0x5d)) {
                    more_1 = 1;
                    pbVar24 = pbVar22;
                  }
                  else {
                    more_1 = 0;
                    pbVar24 = pbVar22 + 1;
                    if ((long)end - (long)pbVar24 < 2) {
LAB_001172b0:
                      pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
                    }
                    else if ((char)*pbVar24 < '!') {
                      if ((*pbVar24 != 0x20) || ((char)pbVar22[2] < '!')) goto LAB_001172b0;
                      pbVar24 = pbVar22 + 2;
                    }
                  }
                }
                __n = 3;
                __s = local_48;
                do {
                  if (more_1 == 0) {
                    if (__n == 0) {
LAB_00116fd8:
                      iVar1 = 0;
                    }
                    else if ((ctx->flags & 0x10) == 0) {
LAB_00116fc6:
                      iVar1 = 0;
                      memset(__s,0,__n);
                    }
                    else {
LAB_00116fdd:
                      local_90 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,0x21)
                      ;
                      iVar1 = 1;
                    }
                    break;
                  }
                  _val = _val & 0xffffff00;
                  value = 0;
                  local_80 = local_80 & 0xffffffff00000000;
                  pbVar22 = pbVar24;
                  if ((pbVar24 != (byte *)end) &&
                     (pbVar22 = (byte *)flatcc_json_parser_integer
                                                  (ctx,(char *)pbVar24,end,(int *)&local_80,&value),
                     pbVar22 != pbVar24)) {
                    if ((int)local_80 == 0) {
                      uVar6 = value;
                      if (value < 0x80) goto LAB_00116cfe;
                      iVar1 = 7;
                    }
                    else {
                      if (value < 0x81) {
                        uVar6 = -value;
LAB_00116cfe:
                        _val = CONCAT31(uStack_9b,(char)uVar6);
                        goto LAB_00116d02;
                      }
                      iVar1 = 8;
                    }
                    pbVar22 = (byte *)flatcc_json_parser_set_error(ctx,(char *)pbVar22,end,iVar1);
                  }
LAB_00116d02:
                  if ((pbVar24 == pbVar22) &&
                     (pbVar24 = (byte *)flatcc_json_parser_symbolic_int8
                                                  (ctx,(char *)pbVar22,end,
                                                   (flatcc_json_parser_integral_symbol_f **)
                                                                                                      
                                                  MyGame_Example_FooBar_parse_json_struct_inline_symbolic_parsers
                                                  ,&val), bVar27 = pbVar24 == pbVar22,
                     pbVar22 = pbVar24, pbVar24 == (byte *)end || bVar27)) {
                    iVar1 = 6;
LAB_00116d7d:
                    bVar27 = false;
                  }
                  else {
                    if (__n == 0) {
                      if ((ctx->flags & 8) == 0) {
                        local_90 = (ulong *)flatcc_json_parser_set_error
                                                      (ctx,(char *)pbVar22,end,0x22);
                        iVar1 = 1;
                        __n = 0;
                        pbVar24 = pbVar22;
                        goto LAB_00116d7d;
                      }
                      __n = 0;
                    }
                    else {
                      *(int8_t *)__s = val;
                      __n = __n - 1;
                      __s = (uint *)((long)__s + 1);
                    }
                    pbVar24 = (byte *)flatcc_json_parser_array_end(ctx,(char *)pbVar22,end,&more_1);
                    iVar1 = 0;
                    bVar27 = true;
                  }
                } while (bVar27);
              }
              puVar20 = local_90;
              if (iVar1 != 0) {
LAB_001174de:
                buf = (char *)puVar20;
                if (iVar1 == 6) {
                  buf = flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,0x23);
                }
                break;
              }
            }
            else if (uVar26 < 0x7465737473000000) {
              if ((uVar26 & 0x7fffff0000000000) == 0x666f6f0000000000) {
                if (3 < (long)uVar8) {
                  bVar18 = *(byte *)((long)buf + 3);
                  if (ctx->unquoted == 0) {
                    if (bVar18 == 0x22) {
                      pbVar24 = (byte *)((long)buf + 4);
                      goto LAB_00116a02;
                    }
                  }
                  else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
                    pbVar24 = (byte *)((long)buf + 3);
                    ctx->unquoted = 0;
LAB_00116a02:
                    if ((long)end - (long)pbVar24 < 2) {
LAB_00116a4e:
                      pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
                    }
                    else if ((char)*pbVar24 < '!') {
                      if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_00116a4e;
                      pbVar24 = pbVar24 + 1;
                    }
                    if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
                      puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,4);
                    }
                    else {
                      puVar25 = (ulong *)(pbVar24 + 1);
                      if ((long)end - (long)puVar25 < 2) {
LAB_00117009:
                        puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
                      }
                      else if ((char)(byte)*puVar25 < '!') {
                        if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!')) goto LAB_00117009;
                        puVar25 = (ulong *)(pbVar24 + 2);
                      }
                    }
                  }
                }
                puVar20 = local_90;
                if ((ulong *)buf != puVar25) {
                  if ((puVar25 == (ulong *)end) || ((byte)*puVar25 != 0x5b)) {
                    more_1 = 0;
                    pbVar24 = (byte *)flatcc_json_parser_set_error(ctx,(char *)puVar25,end,0x16);
                    puVar20 = local_90;
                  }
                  else {
                    pbVar22 = (byte *)((long)puVar25 + 1);
                    if ((long)end - (long)pbVar22 < 2) {
LAB_0011707a:
                      pbVar22 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar22,end);
                    }
                    else if ((char)*pbVar22 < '!') {
                      if ((*pbVar22 != 0x20) || ((char)*(byte *)((long)puVar25 + 2) < '!'))
                      goto LAB_0011707a;
                      pbVar22 = (byte *)((long)puVar25 + 2);
                    }
                    if ((pbVar22 == (byte *)end) || (*pbVar22 != 0x5d)) {
                      more_1 = 1;
                      pbVar24 = pbVar22;
                    }
                    else {
                      more_1 = 0;
                      pbVar24 = pbVar22 + 1;
                      if ((long)end - (long)pbVar24 < 2) {
LAB_001172f1:
                        pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
                      }
                      else if ((char)*pbVar24 < '!') {
                        if ((*pbVar24 != 0x20) || ((char)pbVar22[2] < '!')) goto LAB_001172f1;
                        pbVar24 = pbVar22 + 2;
                      }
                    }
                  }
                  local_78 = 0x10;
                  local_70 = local_50;
                  do {
                    if (more_1 == 0) {
                      if (local_78 == 0) {
                        iVar1 = 0;
                      }
                      else if ((ctx->flags & 0x10) == 0) {
                        iVar1 = 0;
                        memset(local_70,0,local_78 << 2);
                      }
                      else {
                        puVar20 = (ulong *)flatcc_json_parser_set_error
                                                     (ctx,(char *)pbVar24,end,0x21);
                        iVar1 = 1;
                      }
                      break;
                    }
                    value = value & 0xffffffff00000000;
                    pbVar22 = (byte *)flatcc_json_parser_float
                                                (ctx,(char *)pbVar24,end,(float *)&value);
                    bVar27 = pbVar24 == pbVar22;
                    pbVar24 = pbVar22;
                    if ((bVar27) &&
                       (local_90 = puVar20,
                       pbVar24 = (byte *)flatcc_json_parser_symbolic_float
                                                   (ctx,(char *)pbVar22,end,
                                                    (flatcc_json_parser_integral_symbol_f **)
                                                                                                        
                                                  MyGame_Example_FooBar_parse_json_struct_inline_symbolic_parsers_218
                                                  ,(float *)&value), puVar20 = local_90,
                       pbVar24 == (byte *)end || pbVar24 == pbVar22)) {
                      iVar1 = 6;
                      bVar27 = false;
                    }
                    else {
                      if (local_78 == 0) {
                        if ((ctx->flags & 8) == 0) {
                          puVar20 = (ulong *)flatcc_json_parser_set_error
                                                       (ctx,(char *)pbVar24,end,0x22);
                          iVar1 = 1;
                          bVar27 = false;
                          local_78 = 0;
                          goto LAB_00117425;
                        }
                        local_78 = 0;
                      }
                      else {
                        *local_70 = (undefined4)value;
                        local_78 = local_78 + -1;
                        local_70 = local_70 + 1;
                      }
                      pbVar24 = (byte *)flatcc_json_parser_array_end
                                                  (ctx,(char *)pbVar24,end,&more_1);
                      iVar1 = 0;
                      bVar27 = true;
                    }
LAB_00117425:
                  } while (bVar27);
                  if (iVar1 == 0) goto LAB_00117494;
                  goto LAB_001174de;
                }
              }
LAB_0011714b:
              pbVar24 = (byte *)flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar25,end);
              puVar20 = local_90;
            }
            else if ((uVar26 & 0xffffffff00000000) == 0x7465787400000000) {
              if (4 < (long)uVar8) {
                bVar18 = *(byte *)((long)buf + 4);
                if (ctx->unquoted == 0) {
                  if (bVar18 == 0x22) {
                    pbVar24 = (byte *)((long)buf + 5);
                    goto LAB_00116a30;
                  }
                }
                else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
                  pbVar24 = (byte *)((long)buf + 4);
                  ctx->unquoted = 0;
LAB_00116a30:
                  if ((long)end - (long)pbVar24 < 2) {
LAB_00116aa4:
                    pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
                  }
                  else if ((char)*pbVar24 < '!') {
                    if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_00116aa4;
                    pbVar24 = pbVar24 + 1;
                  }
                  if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
                    puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,4);
                  }
                  else {
                    puVar25 = (ulong *)(pbVar24 + 1);
                    if ((long)end - (long)puVar25 < 2) {
LAB_001170ce:
                      puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
                    }
                    else if ((char)(byte)*puVar25 < '!') {
                      if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!')) goto LAB_001170ce;
                      puVar25 = (ulong *)(pbVar24 + 2);
                    }
                  }
                }
              }
              if ((ulong *)buf == puVar25) goto LAB_0011714b;
              pbVar24 = (byte *)flatcc_json_parser_char_array(ctx,(char *)puVar25,end,base,5);
              puVar20 = local_90;
            }
            else {
              if ((uVar26 & 0xffffffffff000000) != 0x7465737473000000) goto LAB_0011714b;
              if (5 < (long)uVar8) {
                bVar18 = *(byte *)((long)buf + 5);
                if (ctx->unquoted == 0) {
                  if (bVar18 == 0x22) {
                    pbVar24 = (byte *)((long)buf + 6);
                    goto LAB_00116b31;
                  }
                }
                else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
                  pbVar24 = (byte *)((long)buf + 5);
                  ctx->unquoted = 0;
LAB_00116b31:
                  if ((long)end - (long)pbVar24 < 2) {
LAB_00116b4f:
                    pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
                  }
                  else if ((char)*pbVar24 < '!') {
                    if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_00116b4f;
                    pbVar24 = pbVar24 + 1;
                  }
                  if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
                    puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,4);
                  }
                  else {
                    puVar25 = (ulong *)(pbVar24 + 1);
                    if ((long)end - (long)puVar25 < 2) {
LAB_00117104:
                      puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
                    }
                    else if ((char)(byte)*puVar25 < '!') {
                      if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!')) goto LAB_00117104;
                      puVar25 = (ulong *)(pbVar24 + 2);
                    }
                  }
                }
              }
              if ((ulong *)buf == puVar25) goto LAB_0011714b;
              if ((puVar25 == (ulong *)end) || ((byte)*puVar25 != 0x5b)) {
                more_1 = 0;
                pbVar24 = (byte *)flatcc_json_parser_set_error(ctx,(char *)puVar25,end,0x16);
              }
              else {
                pbVar22 = (byte *)((long)puVar25 + 1);
                if ((long)end - (long)pbVar22 < 2) {
LAB_00117177:
                  pbVar22 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar22,end);
                }
                else if ((char)*pbVar22 < '!') {
                  if ((*pbVar22 != 0x20) || ((char)*(byte *)((long)puVar25 + 2) < '!'))
                  goto LAB_00117177;
                  pbVar22 = (byte *)((long)puVar25 + 2);
                }
                if ((pbVar22 == (byte *)end) || (*pbVar22 != 0x5d)) {
                  more_1 = 1;
                  pbVar24 = pbVar22;
                }
                else {
                  more_1 = 0;
                  pbVar24 = pbVar22 + 1;
                  if ((long)end - (long)pbVar24 < 2) {
LAB_001174c9:
                    pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
                  }
                  else if ((char)*pbVar24 < '!') {
                    if ((*pbVar24 != 0x20) || ((char)pbVar22[2] < '!')) goto LAB_001174c9;
                    pbVar24 = pbVar22 + 2;
                  }
                }
              }
              puVar4 = local_60;
              if (more_1 == 0) {
                lVar21 = 2;
              }
              else {
                lVar21 = 2;
                do {
                  if (lVar21 == 0) {
                    if ((ctx->flags & 8) == 0) {
                      iVar1 = 0x22;
                      goto LAB_0011726c;
                    }
                    lVar21 = 0;
                  }
                  else {
                    pbVar24 = (byte *)MyGame_Example_Test_parse_json_struct_inline
                                                (ctx,(char *)pbVar24,end,puVar4);
                    lVar21 = lVar21 + -1;
                    puVar4 = puVar4 + 1;
                  }
                  pbVar24 = (byte *)flatcc_json_parser_array_end(ctx,(char *)pbVar24,end,&more_1);
                } while (more_1 != 0);
              }
              bVar27 = true;
              if (lVar21 != 0) {
                if ((ctx->flags & 0x10) == 0) {
                  memset(puVar4,0,lVar21 << 2);
                }
                else {
                  iVar1 = 0x21;
LAB_0011726c:
                  local_90 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,iVar1);
                  bVar27 = false;
                }
              }
              buf = (char *)local_90;
              puVar20 = local_90;
              if (!bVar27) break;
            }
LAB_00117494:
            local_90 = puVar20;
            buf = flatcc_json_parser_object_end(ctx,(char *)pbVar24,end,&more_1);
          } while (more_1 != 0);
        }
      }
      else if (uVar26 == 0x6d616e79616e795f) {
        puVar25 = (ulong *)((long)buf + 8);
        uVar8 = (long)end - (long)puVar25;
        if (uVar8 < 8) {
          uVar26 = 0;
          switch(uVar8) {
          case 7:
            uVar26 = (long)(char)*(byte *)((long)buf + 0xe) << 8;
          case 6:
            uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 0xd) << 0x10;
          case 5:
            uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 0xc) << 0x18;
          case 4:
            uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 0xb) << 0x20;
          case 3:
            uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 10) << 0x28;
          case 2:
            uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 9) << 0x30;
          case 1:
            uVar26 = uVar26 | (ulong)(byte)*puVar25 << 0x38;
          }
        }
        else {
          uVar26 = *puVar25;
          uVar26 = (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                   (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38;
        }
        if ((uVar26 & 0xffffffff00000000) != 0x7479706500000000) goto LAB_001150f2;
        puVar20 = puVar25;
        if (4 < (long)uVar8) {
          bVar18 = *(byte *)((long)buf + 0xc);
          if (ctx->unquoted == 0) {
            if (bVar18 == 0x22) {
              pbVar24 = (byte *)((long)buf + 0xd);
              goto LAB_001152aa;
            }
          }
          else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
            pbVar24 = (byte *)((long)buf + 0xc);
            ctx->unquoted = 0;
LAB_001152aa:
            if ((long)end - (long)pbVar24 < 2) {
LAB_0011544d:
              pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
            }
            else if ((char)*pbVar24 < '!') {
              if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_0011544d;
              pbVar24 = pbVar24 + 1;
            }
            if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
              puVar20 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,4);
            }
            else {
              puVar20 = (ulong *)(pbVar24 + 1);
              if ((long)end - (long)puVar20 < 2) {
LAB_00115b05:
                puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
              }
              else if ((char)(byte)*puVar20 < '!') {
                if (((byte)*puVar20 != 0x20) || ((char)pbVar24[2] < '!')) goto LAB_00115b05;
                puVar20 = (ulong *)(pbVar24 + 2);
              }
            }
          }
        }
        buf = (char *)puVar20;
        if (puVar25 == puVar20) goto LAB_00115926;
        buf = flatcc_json_parser_union_type_vector
                        (ctx,(char *)puVar20,end,0,3,h_unions,
                         MyGame_Example_Alt_parse_json_table::symbolic_parsers,
                         MyGame_Example_Any_parse_json_union,
                         MyGame_Example_Any_json_union_accept_type);
      }
      else {
        if ((uVar26 & 0x7fffffffffffff00) == 0x6d616e79616e7900) {
          puVar25 = (ulong *)buf;
          if (7 < (long)uVar8) {
            bVar18 = *(byte *)((long)buf + 7);
            if (ctx->unquoted == 0) {
              if (bVar18 == 0x22) {
                puVar20 = (ulong *)((long)buf + 8);
                goto LAB_00115226;
              }
            }
            else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
              puVar20 = (ulong *)((long)buf + 7);
              ctx->unquoted = 0;
LAB_00115226:
              if ((long)end - (long)puVar20 < 2) {
LAB_00115392:
                puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
              }
              else if ((char)(byte)*puVar20 < '!') {
                if (((byte)*puVar20 != 0x20) || ((char)*(byte *)((long)puVar20 + 1) < '!'))
                goto LAB_00115392;
                puVar20 = (ulong *)((long)puVar20 + 1);
              }
              if ((puVar20 == (ulong *)end) || ((byte)*puVar20 != 0x3a)) {
                puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar20,end,4);
              }
              else {
                puVar25 = (ulong *)((long)puVar20 + 1);
                if ((long)end - (long)puVar25 < 2) {
LAB_0011587f:
                  puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
                }
                else if ((char)*(byte *)puVar25 < '!') {
                  if ((*(byte *)puVar25 != 0x20) || ((char)*(byte *)((long)puVar20 + 2) < '!'))
                  goto LAB_0011587f;
                  puVar25 = (ulong *)((long)puVar20 + 2);
                }
              }
            }
          }
          bVar27 = (ulong *)buf != puVar25;
          buf = (char *)puVar25;
          if (bVar27) {
            buf = flatcc_json_parser_union_vector
                            (ctx,(char *)puVar25,end,0,3,h_unions,
                             MyGame_Example_Any_parse_json_union);
            goto LAB_00115931;
          }
        }
        if ((uVar26 & 0x7fffffffff000000) != 0x6d6f766965000000) goto LAB_00115926;
        puVar25 = (ulong *)buf;
        if (5 < (long)end - (long)buf) {
          bVar18 = *(byte *)((long)buf + 5);
          if (ctx->unquoted == 0) {
            if (bVar18 == 0x22) {
              pbVar24 = (byte *)((long)buf + 6);
              goto LAB_00115972;
            }
          }
          else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
            pbVar24 = (byte *)((long)buf + 5);
            ctx->unquoted = 0;
LAB_00115972:
            if ((long)end - (long)pbVar24 < 2) {
LAB_00115990:
              pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
            }
            else if ((char)*pbVar24 < '!') {
              if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_00115990;
              pbVar24 = pbVar24 + 1;
            }
            if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
              puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,4);
            }
            else {
              puVar25 = (ulong *)(pbVar24 + 1);
              if ((long)end - (long)puVar25 < 2) {
LAB_00115b5d:
                puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
              }
              else if ((char)(byte)*puVar25 < '!') {
                if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!')) goto LAB_00115b5d;
                puVar25 = (ulong *)(pbVar24 + 2);
              }
            }
          }
        }
        bVar27 = (ulong *)buf == puVar25;
        buf = (char *)puVar25;
        if (bVar27) goto LAB_00115926;
        buf = Fantasy_Movie_parse_json_table(ctx,(char *)puVar25,end,&ref);
        if (ref == 0) goto LAB_00114a09;
        pfVar23 = ctx->ctx;
        iVar1 = 1;
LAB_00117670:
        pfVar7 = flatcc_builder_table_add_offset(pfVar23,iVar1);
        if (pfVar7 == (flatcc_builder_ref_t *)0x0) goto LAB_00114a09;
        *pfVar7 = ref;
      }
    }
    else {
      puVar25 = (ulong *)buf;
      if (uVar26 < 0x7072656669780000) {
        if ((uVar26 & 0x7fffffffff000000) == 0x6e616d6573000000) {
          if (5 < (long)uVar8) {
            bVar18 = *(byte *)((long)buf + 5);
            if (ctx->unquoted == 0) {
              if (bVar18 == 0x22) {
                pbVar24 = (byte *)((long)buf + 6);
                goto LAB_0011510d;
              }
            }
            else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
              pbVar24 = (byte *)((long)buf + 5);
              ctx->unquoted = 0;
LAB_0011510d:
              if ((long)end - (long)pbVar24 < 2) {
LAB_0011512b:
                pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
              }
              else if ((char)*pbVar24 < '!') {
                if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_0011512b;
                pbVar24 = pbVar24 + 1;
              }
              if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
                puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,4);
              }
              else {
                puVar25 = (ulong *)(pbVar24 + 1);
                if ((long)end - (long)puVar25 < 2) {
LAB_0011551d:
                  puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
                }
                else if ((char)(byte)*puVar25 < '!') {
                  if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!')) goto LAB_0011551d;
                  puVar25 = (ulong *)(pbVar24 + 2);
                }
              }
            }
          }
          if ((ulong *)buf == puVar25) goto LAB_00115dad;
          iVar1 = flatcc_builder_start_offset_vector(ctx->ctx);
          buf = (char *)puVar25;
          if (iVar1 == 0) {
            if ((puVar25 == (ulong *)end) || ((byte)*puVar25 != 0x5b)) {
              more = 0;
              buf = flatcc_json_parser_set_error(ctx,(char *)puVar25,end,0x16);
            }
            else {
              puVar20 = (ulong *)((long)puVar25 + 1);
              if ((long)end - (long)puVar20 < 2) {
LAB_001155b1:
                puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
              }
              else if ((char)*(byte *)puVar20 < '!') {
                if ((*(byte *)puVar20 != 0x20) || ((char)*(byte *)((long)puVar25 + 2) < '!'))
                goto LAB_001155b1;
                puVar20 = (ulong *)((long)puVar25 + 2);
              }
              if ((puVar20 == (ulong *)end) || ((byte)*puVar20 != 0x5d)) {
                more = 1;
                buf = (char *)puVar20;
              }
              else {
                more = 0;
                buf = (char *)((long)puVar20 + 1);
                if ((long)end - (long)buf < 2) {
LAB_00115bb8:
                  buf = flatcc_json_parser_space_ext(ctx,buf,end);
                }
                else if (*buf < '!') {
                  if ((*buf != 0x20) || ((char)*(byte *)((long)puVar20 + 2) < '!'))
                  goto LAB_00115bb8;
                  buf = (char *)((long)puVar20 + 2);
                }
              }
            }
            while (more != 0) {
              buf = flatcc_json_parser_build_string(ctx,buf,end,&ref);
              if ((ref == 0) ||
                 (pfVar7 = flatcc_builder_extend_offset_vector(ctx->ctx,1),
                 pfVar7 == (flatcc_builder_ref_t *)0x0)) goto LAB_00114a09;
              *pfVar7 = ref;
              buf = flatcc_json_parser_array_end(ctx,buf,end,&more);
            }
            ref = flatcc_builder_end_offset_vector(ctx->ctx);
            if (ref != 0) {
              pfVar23 = ctx->ctx;
              iVar1 = 6;
              goto LAB_00117670;
            }
          }
        }
        else {
          if ((uVar26 & 0x7fffffffffff0000) != 0x6d756c74696b0000) goto LAB_00115926;
          if (6 < (long)uVar8) {
            bVar18 = *(byte *)((long)buf + 6);
            if (ctx->unquoted == 0) {
              if (bVar18 == 0x22) {
                pbVar24 = (byte *)((long)buf + 7);
                goto LAB_001151e4;
              }
            }
            else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
              pbVar24 = (byte *)((long)buf + 6);
              ctx->unquoted = 0;
LAB_001151e4:
              if ((long)end - (long)pbVar24 < 2) {
LAB_00115338:
                pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
              }
              else if ((char)*pbVar24 < '!') {
                if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_00115338;
                pbVar24 = pbVar24 + 1;
              }
              if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
                puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,4);
              }
              else {
                puVar25 = (ulong *)(pbVar24 + 1);
                if ((long)end - (long)puVar25 < 2) {
LAB_00115794:
                  puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
                }
                else if ((char)(byte)*puVar25 < '!') {
                  if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!')) goto LAB_00115794;
                  puVar25 = (ulong *)(pbVar24 + 2);
                }
              }
            }
          }
          if ((ulong *)buf == puVar25) goto LAB_00115dad;
          iVar1 = flatcc_builder_start_offset_vector(ctx->ctx);
          buf = (char *)puVar25;
          if (iVar1 == 0) {
            if ((puVar25 == (ulong *)end) || ((byte)*puVar25 != 0x5b)) {
              more = 0;
              buf = flatcc_json_parser_set_error(ctx,(char *)puVar25,end,0x16);
            }
            else {
              puVar20 = (ulong *)((long)puVar25 + 1);
              if ((long)end - (long)puVar20 < 2) {
LAB_0011581e:
                puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
              }
              else if ((char)*(byte *)puVar20 < '!') {
                if ((*(byte *)puVar20 != 0x20) || ((char)*(byte *)((long)puVar25 + 2) < '!'))
                goto LAB_0011581e;
                puVar20 = (ulong *)((long)puVar25 + 2);
              }
              if ((puVar20 == (ulong *)end) || ((byte)*puVar20 != 0x5d)) {
                more = 1;
                buf = (char *)puVar20;
              }
              else {
                more = 0;
                buf = (char *)((long)puVar20 + 1);
                if ((long)end - (long)buf < 2) {
LAB_00115e6a:
                  buf = flatcc_json_parser_space_ext(ctx,buf,end);
                }
                else if (*buf < '!') {
                  if ((*buf != 0x20) || ((char)*(byte *)((long)puVar20 + 2) < '!'))
                  goto LAB_00115e6a;
                  buf = (char *)((long)puVar20 + 2);
                }
              }
            }
            while (more != 0) {
              ref = 0;
              iVar1 = flatcc_builder_start_table(ctx->ctx,3);
              if (iVar1 == 0) {
                if ((buf == end) || ((byte)*(ulong *)buf != 0x7b)) {
                  _val = 0;
                  buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
                }
                else {
                  puVar25 = (ulong *)((long)buf + 1);
                  if ((long)end - (long)puVar25 < 2) {
LAB_00115f03:
                    puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
                  }
                  else if ((char)*(byte *)puVar25 < '!') {
                    if ((*(byte *)puVar25 != 0x20) || ((char)*(byte *)((long)buf + 2) < '!'))
                    goto LAB_00115f03;
                    puVar25 = (ulong *)((long)buf + 2);
                  }
                  if ((puVar25 == (ulong *)end) || ((byte)*puVar25 != 0x7d)) {
                    _val = 1;
                    buf = (char *)puVar25;
                  }
                  else {
                    _val = 0;
                    buf = (char *)((long)puVar25 + 1);
                    if ((long)end - (long)buf < 2) {
LAB_00115f67:
                      buf = flatcc_json_parser_space_ext(ctx,buf,end);
                    }
                    else if (*buf < '!') {
                      if ((*buf != 0x20) || ((char)*(byte *)((long)puVar25 + 2) < '!'))
                      goto LAB_00115f67;
                      buf = (char *)((long)puVar25 + 2);
                    }
                  }
                }
                while (_val != 0) {
                  if (buf != end) {
                    if ((byte)*(ulong *)buf == 0x2e) {
                      buf = flatcc_json_parser_set_error(ctx,buf,end,5);
                    }
                    else if ((byte)*(ulong *)buf == 0x22) {
                      buf = (char *)((long)buf + 1);
                      ctx->unquoted = 0;
                    }
                    else {
                      ctx->unquoted = 1;
                    }
                  }
                  uVar8 = (long)end - (long)buf;
                  if (uVar8 < 8) {
                    uVar26 = 0;
                    switch(uVar8) {
                    case 7:
                      uVar26 = (long)(char)*(byte *)((long)buf + 6) << 8;
                    case 6:
                      uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 5) << 0x10;
                    case 5:
                      uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 4) << 0x18;
                    case 4:
                      uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 3) << 0x20;
                    case 3:
                      uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 2) << 0x28;
                    case 2:
                      uVar26 = uVar26 | (long)(char)*(byte *)((long)buf + 1) << 0x30;
                    case 1:
                      uVar26 = uVar26 | (ulong)(byte)*(ulong *)buf << 0x38;
                    }
                  }
                  else {
                    uVar26 = *(ulong *)buf;
                    uVar26 = uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                             (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                             (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                             (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38;
                  }
                  if (uVar26 < 0x68656c6c6f000000) {
                    if ((uVar26 & 0x7fffffffffff0000) == 0x666f6f6261720000) {
                      puVar25 = (ulong *)buf;
                      if (6 < (long)uVar8) {
                        bVar18 = *(byte *)((long)buf + 6);
                        if (ctx->unquoted == 0) {
                          if (bVar18 == 0x22) {
                            pbVar24 = (byte *)((long)buf + 7);
                            goto LAB_0011617c;
                          }
                        }
                        else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
                          pbVar24 = (byte *)((long)buf + 6);
                          ctx->unquoted = 0;
LAB_0011617c:
                          if ((long)end - (long)pbVar24 < 2) {
LAB_0011619a:
                            pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
                          }
                          else if ((char)*pbVar24 < '!') {
                            if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_0011619a;
                            pbVar24 = pbVar24 + 1;
                          }
                          if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
                            puVar25 = (ulong *)flatcc_json_parser_set_error
                                                         (ctx,(char *)pbVar24,end,4);
                          }
                          else {
                            puVar25 = (ulong *)(pbVar24 + 1);
                            if ((long)end - (long)puVar25 < 2) {
LAB_00116330:
                              puVar25 = (ulong *)flatcc_json_parser_space_ext
                                                           (ctx,(char *)puVar25,end);
                            }
                            else if ((char)(byte)*puVar25 < '!') {
                              if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!'))
                              goto LAB_00116330;
                              puVar25 = (ulong *)(pbVar24 + 2);
                            }
                          }
                        }
                      }
                      if ((ulong *)buf == puVar25) {
                        buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar25,end);
                      }
                      else {
                        local_80 = 0;
                        value = 0;
                        more_1 = 0;
                        puVar20 = puVar25;
                        uVar6 = local_80;
                        if ((puVar25 != (ulong *)end) &&
                           (puVar20 = (ulong *)flatcc_json_parser_integer
                                                         (ctx,(char *)puVar25,end,&more_1,&value),
                           uVar6 = local_80, puVar20 != puVar25)) {
                          if (more_1 == 0) {
                            uVar6 = value;
                            if ((long)value < 0) {
                              iVar1 = 7;
                              goto LAB_001163dd;
                            }
                          }
                          else if (value < 0x8000000000000001) {
                            uVar6 = -value;
                          }
                          else {
                            iVar1 = 8;
LAB_001163dd:
                            puVar20 = (ulong *)flatcc_json_parser_set_error
                                                         (ctx,(char *)puVar20,end,iVar1);
                            uVar6 = local_80;
                          }
                        }
                        local_80 = uVar6;
                        if ((puVar25 == puVar20) &&
                           (buf = flatcc_json_parser_symbolic_int64
                                            (ctx,(char *)puVar20,end,
                                             (flatcc_json_parser_integral_symbol_f **)
                                             MyGame_Example_MultipleKeys_parse_json_table_symbolic_parsers
                                             ,(int64_t *)&local_80),
                           bVar27 = (ulong *)buf == puVar20, puVar20 = (ulong *)buf,
                           buf == end || bVar27)) {
LAB_00116470:
                          bVar27 = false;
                        }
                        else {
                          uVar6 = local_80;
                          buf = (char *)puVar20;
                          if ((local_80 != 0) || (bVar27 = true, (ctx->flags & 2) != 0)) {
                            puVar5 = (uint64_t *)flatcc_builder_table_add(ctx->ctx,2,8,8);
                            if (puVar5 == (uint64_t *)0x0) goto LAB_00116470;
                            *puVar5 = uVar6;
                            bVar27 = true;
                          }
                        }
                        if (!bVar27) goto LAB_00116537;
                      }
                    }
                    else {
LAB_0011650a:
                      buf = flatcc_json_parser_unmatched_symbol(ctx,buf,end);
                    }
                  }
                  else {
                    if ((uVar26 & 0xffffffffff000000) == 0x68656c6c6f000000) {
                      puVar25 = (ulong *)buf;
                      if (5 < (long)uVar8) {
                        bVar18 = *(byte *)((long)buf + 5);
                        if (ctx->unquoted == 0) {
                          if (bVar18 == 0x22) {
                            pbVar24 = (byte *)((long)buf + 6);
                            goto LAB_00116242;
                          }
                        }
                        else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
                          pbVar24 = (byte *)((long)buf + 5);
                          ctx->unquoted = 0;
LAB_00116242:
                          if ((long)end - (long)pbVar24 < 2) {
LAB_001162ca:
                            pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
                          }
                          else if ((char)*pbVar24 < '!') {
                            if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_001162ca;
                            pbVar24 = pbVar24 + 1;
                          }
                          if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
                            puVar25 = (ulong *)flatcc_json_parser_set_error
                                                         (ctx,(char *)pbVar24,end,4);
                          }
                          else {
                            puVar25 = (ulong *)(pbVar24 + 1);
                            if ((long)end - (long)puVar25 < 2) {
LAB_001164bd:
                              puVar25 = (ulong *)flatcc_json_parser_space_ext
                                                           (ctx,(char *)puVar25,end);
                            }
                            else if ((char)(byte)*puVar25 < '!') {
                              if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!'))
                              goto LAB_001164bd;
                              puVar25 = (ulong *)(pbVar24 + 2);
                            }
                          }
                        }
                      }
                      bVar27 = (ulong *)buf == puVar25;
                      buf = (char *)puVar25;
                      if (bVar27) goto LAB_0011650a;
                      buf = flatcc_json_parser_build_string(ctx,(char *)puVar25,end,&ref_1);
                      if (ref_1 == 0) goto LAB_00116537;
                      pfVar23 = ctx->ctx;
                      iVar1 = 0;
                    }
                    else {
                      if ((uVar26 & 0xffffffffff000000) != 0x776f726c64000000) goto LAB_0011650a;
                      puVar25 = (ulong *)buf;
                      if (5 < (long)uVar8) {
                        bVar18 = *(byte *)((long)buf + 5);
                        if (ctx->unquoted == 0) {
                          if (bVar18 == 0x22) {
                            pbVar24 = (byte *)((long)buf + 6);
                            goto LAB_00116213;
                          }
                        }
                        else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
                          pbVar24 = (byte *)((long)buf + 5);
                          ctx->unquoted = 0;
LAB_00116213:
                          if ((long)end - (long)pbVar24 < 2) {
LAB_00116264:
                            pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
                          }
                          else if ((char)*pbVar24 < '!') {
                            if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_00116264;
                            pbVar24 = pbVar24 + 1;
                          }
                          if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
                            puVar25 = (ulong *)flatcc_json_parser_set_error
                                                         (ctx,(char *)pbVar24,end,4);
                          }
                          else {
                            puVar25 = (ulong *)(pbVar24 + 1);
                            if ((long)end - (long)puVar25 < 2) {
LAB_0011647f:
                              puVar25 = (ulong *)flatcc_json_parser_space_ext
                                                           (ctx,(char *)puVar25,end);
                            }
                            else if ((char)(byte)*puVar25 < '!') {
                              if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!'))
                              goto LAB_0011647f;
                              puVar25 = (ulong *)(pbVar24 + 2);
                            }
                          }
                        }
                      }
                      bVar27 = (ulong *)buf == puVar25;
                      buf = (char *)puVar25;
                      if (bVar27) goto LAB_0011650a;
                      buf = flatcc_json_parser_build_string(ctx,(char *)puVar25,end,&ref_1);
                      if (ref_1 == 0) goto LAB_00116537;
                      pfVar23 = ctx->ctx;
                      iVar1 = 1;
                    }
                    pfVar7 = flatcc_builder_table_add_offset(pfVar23,iVar1);
                    if (pfVar7 == (flatcc_builder_ref_t *)0x0) goto LAB_00116537;
                    *pfVar7 = ref_1;
                  }
                  buf = flatcc_json_parser_object_end(ctx,buf,end,(int *)&val);
                }
                if ((ctx->error != 0) || (ref = flatcc_builder_end_table(ctx->ctx), ref == 0))
                goto LAB_00116537;
              }
              else {
LAB_00116537:
                buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
              }
              if ((ref == 0) ||
                 (pfVar7 = flatcc_builder_extend_offset_vector(ctx->ctx,1),
                 pfVar7 == (flatcc_builder_ref_t *)0x0)) goto LAB_00114a09;
              *pfVar7 = ref;
              buf = flatcc_json_parser_array_end(ctx,buf,end,&more);
            }
            ref = flatcc_builder_end_offset_vector(ctx->ctx);
            if (ref != 0) {
              pfVar23 = ctx->ctx;
              iVar1 = 4;
              goto LAB_00117670;
            }
          }
        }
        goto LAB_00114a09;
      }
      if (uVar26 < 0x726170756e7a656c) {
        if ((uVar26 & 0x7fffffffffff0000) == 0x7072656669780000) {
          if (6 < (long)uVar8) {
            bVar18 = *(byte *)((long)buf + 6);
            if (ctx->unquoted == 0) {
              if (bVar18 == 0x22) {
                pbVar24 = (byte *)((long)buf + 7);
                goto LAB_001151a3;
              }
            }
            else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
              pbVar24 = (byte *)((long)buf + 6);
              ctx->unquoted = 0;
LAB_001151a3:
              if ((long)end - (long)pbVar24 < 2) {
LAB_001152df:
                pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
              }
              else if ((char)*pbVar24 < '!') {
                if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_001152df;
                pbVar24 = pbVar24 + 1;
              }
              if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
                puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,4);
              }
              else {
                puVar25 = (ulong *)(pbVar24 + 1);
                if ((long)end - (long)puVar25 < 2) {
LAB_00115752:
                  puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
                }
                else if ((char)(byte)*puVar25 < '!') {
                  if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!')) goto LAB_00115752;
                  puVar25 = (ulong *)(pbVar24 + 2);
                }
              }
            }
          }
          bVar27 = (ulong *)buf != puVar25;
          buf = (char *)puVar25;
          if (bVar27) {
            buf = MyGame_Example_TestJSONPrefix_parse_json_table(ctx,(char *)puVar25,end,&ref);
            if (ref != 0) {
              pfVar23 = ctx->ctx;
              iVar1 = 0;
              goto LAB_00117670;
            }
            goto LAB_00114a09;
          }
        }
LAB_00115926:
        buf = flatcc_json_parser_unmatched_symbol(ctx,buf,end);
      }
      else {
        if (uVar26 == 0x726170756e7a656c) {
          puVar20 = (ulong *)((long)buf + 8);
          uVar8 = (long)end - (long)puVar20;
          if (uVar8 < 8) {
            bVar12 = 0;
            bVar13 = 0;
            bVar14 = 0;
            bVar15 = 0;
            bVar16 = 0;
            bVar17 = 0;
            bVar18 = 0;
            switch(uVar8) {
            case 7:
              bVar12 = (char)*(byte *)((long)buf + 0xe) >> 7;
            case 6:
              bVar13 = bVar12 | (char)*(byte *)((long)buf + 0xd) >> 7;
            case 5:
              bVar14 = bVar13 | (char)*(byte *)((long)buf + 0xc) >> 7;
            case 4:
              bVar15 = bVar14 | (char)*(byte *)((long)buf + 0xb) >> 7;
            case 3:
              bVar16 = bVar15 | (char)*(byte *)((long)buf + 10) >> 7;
            case 2:
              bVar17 = bVar16 | (char)*(byte *)((long)buf + 9) >> 7;
            case 1:
              bVar18 = bVar17 | (byte)*puVar20;
            }
          }
          else {
            bVar18 = (byte)*puVar20;
          }
          if (bVar18 != 0x73) goto LAB_001150f2;
          puVar25 = puVar20;
          if (1 < (long)uVar8) {
            bVar18 = *(byte *)((long)buf + 9);
            if (ctx->unquoted == 0) {
              if (bVar18 == 0x22) {
                pbVar24 = (byte *)((long)buf + 10);
                goto LAB_0011564f;
              }
            }
            else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
              pbVar24 = (byte *)((long)buf + 9);
              ctx->unquoted = 0;
LAB_0011564f:
              if ((long)end - (long)pbVar24 < 2) {
LAB_001156cb:
                pbVar24 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar24,end);
              }
              else if ((char)*pbVar24 < '!') {
                if ((*pbVar24 != 0x20) || ((char)pbVar24[1] < '!')) goto LAB_001156cb;
                pbVar24 = pbVar24 + 1;
              }
              if ((pbVar24 == (byte *)end) || (*pbVar24 != 0x3a)) {
                puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar24,end,4);
              }
              else {
                puVar25 = (ulong *)(pbVar24 + 1);
                if ((long)end - (long)puVar25 < 2) {
LAB_00115d45:
                  puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
                }
                else if ((char)(byte)*puVar25 < '!') {
                  if (((byte)*puVar25 != 0x20) || ((char)pbVar24[2] < '!')) goto LAB_00115d45;
                  puVar25 = (ulong *)(pbVar24 + 2);
                }
              }
            }
          }
          if (puVar20 != puVar25) {
            iVar1 = flatcc_builder_start_vector(ctx->ctx,8,4,0x1fffffff);
            buf = (char *)puVar25;
            if (iVar1 == 0) {
              if ((puVar25 == (ulong *)end) || ((byte)*puVar25 != 0x5b)) {
                more = 0;
                buf = flatcc_json_parser_set_error(ctx,(char *)puVar25,end,0x16);
              }
              else {
                puVar20 = (ulong *)((long)puVar25 + 1);
                if ((long)end - (long)puVar20 < 2) {
LAB_00115dfa:
                  puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
                }
                else if ((char)*(byte *)puVar20 < '!') {
                  if ((*(byte *)puVar20 != 0x20) || ((char)*(byte *)((long)puVar25 + 2) < '!'))
                  goto LAB_00115dfa;
                  puVar20 = (ulong *)((long)puVar25 + 2);
                }
                if ((puVar20 == (ulong *)end) || ((byte)*puVar20 != 0x5d)) {
                  more = 1;
                  buf = (char *)puVar20;
                }
                else {
                  more = 0;
                  buf = (char *)((long)puVar20 + 1);
                  if ((long)end - (long)buf < 2) {
LAB_00117600:
                    buf = flatcc_json_parser_space_ext(ctx,buf,end);
                  }
                  else if (*buf < '!') {
                    if ((*buf != 0x20) || ((char)*(byte *)((long)puVar20 + 2) < '!'))
                    goto LAB_00117600;
                    buf = (char *)((long)puVar20 + 2);
                  }
                }
              }
              while (more != 0) {
                struct_base = flatcc_builder_extend_vector(ctx->ctx,1);
                if (struct_base == (void *)0x0) goto LAB_00114a09;
                pcVar3 = Fantasy_Rapunzel_parse_json_struct_inline(ctx,buf,end,struct_base);
                buf = flatcc_json_parser_array_end(ctx,pcVar3,end,&more);
              }
              ref = flatcc_builder_end_vector(ctx->ctx);
              if (ref != 0) {
                pfVar23 = ctx->ctx;
                iVar1 = 5;
                goto LAB_00117670;
              }
            }
            goto LAB_00114a09;
          }
        }
        else {
          if (uVar26 >> 8 != 0x73616d706c6573) goto LAB_00115926;
          if (7 < (long)uVar8) {
            bVar18 = *(byte *)((long)buf + 7);
            if (ctx->unquoted == 0) {
              if (bVar18 == 0x22) {
                puVar20 = (ulong *)((long)buf + 8);
                goto LAB_00115622;
              }
            }
            else if ((char)bVar18 < '!' || bVar18 == 0x3a) {
              puVar20 = (ulong *)((long)buf + 7);
              ctx->unquoted = 0;
LAB_00115622:
              if ((long)end - (long)puVar20 < 2) {
LAB_00115671:
                puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
              }
              else if ((char)(byte)*puVar20 < '!') {
                if (((byte)*puVar20 != 0x20) || ((char)*(byte *)((long)puVar20 + 1) < '!'))
                goto LAB_00115671;
                puVar20 = (ulong *)((long)puVar20 + 1);
              }
              if ((puVar20 == (ulong *)end) || ((byte)*puVar20 != 0x3a)) {
                puVar25 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar20,end,4);
              }
              else {
                puVar25 = (ulong *)((long)puVar20 + 1);
                if ((long)end - (long)puVar25 < 2) {
LAB_00115c41:
                  puVar25 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar25,end);
                }
                else if ((char)*(byte *)puVar25 < '!') {
                  if ((*(byte *)puVar25 != 0x20) || ((char)*(byte *)((long)puVar20 + 2) < '!'))
                  goto LAB_00115c41;
                  puVar25 = (ulong *)((long)puVar20 + 2);
                }
              }
            }
          }
          if ((ulong *)buf != puVar25) {
            iVar1 = flatcc_builder_start_vector(ctx->ctx,4,4,0x3fffffff);
            buf = (char *)puVar25;
            if (iVar1 == 0) {
              if ((puVar25 == (ulong *)end) || ((byte)*puVar25 != 0x5b)) {
                more = 0;
                buf = flatcc_json_parser_set_error(ctx,(char *)puVar25,end,0x16);
              }
              else {
                puVar20 = (ulong *)((long)puVar25 + 1);
                if ((long)end - (long)puVar20 < 2) {
LAB_00115ce4:
                  puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
                }
                else if ((char)*(byte *)puVar20 < '!') {
                  if ((*(byte *)puVar20 != 0x20) || ((char)*(byte *)((long)puVar25 + 2) < '!'))
                  goto LAB_00115ce4;
                  puVar20 = (ulong *)((long)puVar25 + 2);
                }
                if ((puVar20 == (ulong *)end) || ((byte)*puVar20 != 0x5d)) {
                  more = 1;
                  buf = (char *)puVar20;
                }
                else {
                  more = 0;
                  buf = (char *)((long)puVar20 + 1);
                  if ((long)end - (long)buf < 2) {
LAB_00117519:
                    buf = flatcc_json_parser_space_ext(ctx,buf,end);
                  }
                  else if (*buf < '!') {
                    if ((*buf != 0x20) || ((char)*(byte *)((long)puVar20 + 2) < '!'))
                    goto LAB_00117519;
                    buf = (char *)((long)puVar20 + 2);
                  }
                }
              }
              while (more != 0) {
                value = value & 0xffffffff00000000;
                puVar4 = (undefined4 *)flatcc_builder_extend_vector(ctx->ctx,1);
                if (puVar4 == (undefined4 *)0x0) {
                  bVar27 = false;
                }
                else {
                  puVar25 = (ulong *)flatcc_json_parser_float(ctx,buf,end,(float *)&value);
                  bVar27 = (ulong *)buf == puVar25;
                  buf = (char *)puVar25;
                  if ((bVar27) &&
                     (buf = flatcc_json_parser_symbolic_float
                                      (ctx,(char *)puVar25,end,
                                       MyGame_Example_Alt_parse_json_table::symbolic_parsers_1,
                                       (float *)&value), buf == end || (ulong *)buf == puVar25)) {
                    bVar27 = false;
                  }
                  else {
                    *puVar4 = (undefined4)value;
                    buf = flatcc_json_parser_array_end(ctx,buf,end,&more);
                    bVar27 = true;
                  }
                }
                if (!bVar27) goto LAB_00114a09;
              }
              ref = flatcc_builder_end_vector(ctx->ctx);
              if (ref != 0) {
                pfVar23 = ctx->ctx;
                iVar1 = 7;
                goto LAB_00117670;
              }
            }
            goto LAB_00114a09;
          }
        }
LAB_00115dad:
        buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar25,end);
      }
    }
LAB_00115931:
    buf = flatcc_json_parser_object_end(ctx,buf,end,&more);
  }
  if (ctx->error == 0) {
    buf = flatcc_json_parser_finalize_unions(ctx,buf,end,h_unions);
    fVar2 = flatcc_builder_end_table(ctx->ctx);
    *local_38 = fVar2;
    if (fVar2 != 0) {
      return (char *)(ulong *)buf;
    }
  }
LAB_00114a09:
  pcVar3 = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  return pcVar3;
}

Assistant:

static const char *MyGame_Example_Alt_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;
    size_t h_unions;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 9)) goto failed;
    if (end == flatcc_json_parser_prepare_unions(ctx, buf, end, 1, &h_unions)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6d756c74696b0000) { /* branch "multik" */
            if (w < 0x6d616e79616e7900) { /* branch "manyany" */
                if (w == 0x66697865645f6172) { /* descend "fixed_ar" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffff0000000000) == 0x7261790000000000) { /* "ray" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                        if (mark != buf) {
                            if (!(pval = flatcc_builder_table_add(ctx->ctx, 8, 124, 4))) goto failed;
                            buf = MyGame_Example_FooBar_parse_json_struct_inline(ctx, buf, end, pval);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "ray" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "ray" */
                } else { /* descend "fixed_ar" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* descend "fixed_ar" */
            } else { /* branch "manyany" */
                if (w == 0x6d616e79616e795f) { /* descend "manyany_" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffff00000000) == 0x7479706500000000) { /* "type" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 4);
                        if (mark != buf) {
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    MyGame_Example_Any_parse_json_enum,
                                    monster_test_local_MyGame_Example_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_union_type_vector(ctx, buf, end, 0, 3, h_unions, symbolic_parsers, MyGame_Example_Any_parse_json_union, MyGame_Example_Any_json_union_accept_type);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "type" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "type" */
                } else { /* descend "manyany_" */
                    if ((w & 0xffffffffffffff00) == 0x6d616e79616e7900) { /* "manyany" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                        if (mark != buf) {
                            buf = flatcc_json_parser_union_vector(ctx, buf, end, 0, 3, h_unions, MyGame_Example_Any_parse_json_union);
                        } else {
                            goto pfguard1;
                        }
                    } else { /* "manyany" */
                        goto pfguard1;
                    } /* "manyany" */
                    goto endpfguard1;
pfguard1:
                    if ((w & 0xffffffffff000000) == 0x6d6f766965000000) { /* "movie" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                        if (mark != buf) {
                            buf = Fantasy_Movie_parse_json_table(ctx, buf, end, &ref);
                            if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 1))) goto failed;
                            *pref = ref;
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "movie" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "movie" */
endpfguard1:
                    (void)0;
                } /* descend "manyany_" */
            } /* branch "manyany" */
        } else { /* branch "multik" */
            if (w < 0x7072656669780000) { /* branch "prefix" */
                if ((w & 0xffffffffff000000) == 0x6e616d6573000000) { /* "names" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                    if (mark != buf) {
                        if (flatcc_builder_start_offset_vector(ctx->ctx)) goto failed;
                        buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                        while (more) {
                            buf = flatcc_json_parser_build_string(ctx, buf, end, &ref);
                            if (!ref || !(pref = flatcc_builder_extend_offset_vector(ctx->ctx, 1))) goto failed;
                            *pref = ref;
                            buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                        }
                        ref = flatcc_builder_end_offset_vector(ctx->ctx);
                        if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 6))) goto failed;
                        *pref = ref;
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "names" */
                    if ((w & 0xffffffffffff0000) == 0x6d756c74696b0000) { /* "multik" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                        if (mark != buf) {
                            if (flatcc_builder_start_offset_vector(ctx->ctx)) goto failed;
                            buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                            while (more) {
                                buf = MyGame_Example_MultipleKeys_parse_json_table(ctx, buf, end, &ref);
                                if (!ref || !(pref = flatcc_builder_extend_offset_vector(ctx->ctx, 1))) goto failed;
                                *pref = ref;
                                buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                            }
                            ref = flatcc_builder_end_offset_vector(ctx->ctx);
                            if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 4))) goto failed;
                            *pref = ref;
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "multik" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "multik" */
                } /* "names" */
            } else { /* branch "prefix" */
                if (w < 0x726170756e7a656c) { /* branch "rapunzel" */
                    if ((w & 0xffffffffffff0000) == 0x7072656669780000) { /* "prefix" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                        if (mark != buf) {
                            buf = MyGame_Example_TestJSONPrefix_parse_json_table(ctx, buf, end, &ref);
                            if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 0))) goto failed;
                            *pref = ref;
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "prefix" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "prefix" */
                } else { /* branch "rapunzel" */
                    if (w == 0x726170756e7a656c) { /* descend "rapunzel" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xff00000000000000) == 0x7300000000000000) { /* "s" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                            if (mark != buf) {
                                if (flatcc_builder_start_vector(ctx->ctx, 8, 4, UINT64_C(536870911))) goto failed;
                                buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                                while (more) {
                                    if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;
                                    buf = Fantasy_Rapunzel_parse_json_struct_inline(ctx, buf, end, pval);
                                    buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                                }
                                ref = flatcc_builder_end_vector(ctx->ctx);
                                if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 5))) goto failed;
                                *pref = ref;
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "s" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "s" */
                    } else { /* descend "rapunzel" */
                        if ((w & 0xffffffffffffff00) == 0x73616d706c657300) { /* "samples" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                            if (mark != buf) {
                                if (flatcc_builder_start_vector(ctx->ctx, 4, 4, UINT64_C(1073741823))) goto failed;
                                buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                                while (more) {
                                    float val = 0;
                                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                            monster_test_local_MyGame_Example_json_parser_enum,
                                            monster_test_global_json_parser_enum, 0 };
                                    if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;
                                    buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                                    if (mark == buf) {
                                        buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                        if (buf == mark || buf == end) goto failed;
                                    }
                                    flatbuffers_float_write_to_pe(pval, val);
                                    buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                                }
                                ref = flatcc_builder_end_vector(ctx->ctx);
                                if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 7))) goto failed;
                                *pref = ref;
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "samples" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "samples" */
                    } /* descend "rapunzel" */
                } /* branch "rapunzel" */
            } /* branch "prefix" */
        } /* branch "multik" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    buf = flatcc_json_parser_finalize_unions(ctx, buf, end, h_unions);
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}